

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void enable_secondary(bool *secondary,bool track_sources,bool track_tests)

{
  _Base_ptr p_Var1;
  build_mdmap_actions local_98;
  
  if (*secondary == false) {
    for (p_Var1 = s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      local_98.super_module_primary_actions._vptr_module_primary_actions =
           (_func_int **)&PTR_heading_0011e230;
      local_98.module_._M_dataplus._M_p = (pointer)&local_98.module_.field_2;
      local_98.module_._M_string_length = 0;
      local_98.module_.field_2._M_local_buf[0] = '\0';
      local_98.module2_._M_dataplus._M_p = (pointer)&local_98.module2_.field_2;
      local_98.module2_._M_string_length = 0;
      local_98.module2_.field_2._M_local_buf[0] = '\0';
      local_98.header_._M_dataplus._M_p = (pointer)&local_98.header_.field_2;
      local_98.header_._M_string_length = 0;
      local_98.header_.field_2._M_local_buf[0] = '\0';
      scan_module_dependencies
                ((string *)(p_Var1 + 1),&local_98.super_module_primary_actions,track_sources,
                 track_tests,true);
      build_mdmap_actions::~build_mdmap_actions(&local_98);
    }
    *secondary = true;
  }
  return;
}

Assistant:

static void enable_secondary( bool & secondary, bool track_sources, bool track_tests )
{
    if( !secondary )
    {
        try
        {
            build_module_dependency_map( track_sources, track_tests );
        }
        catch( fs::filesystem_error const & x )
        {
            std::cout << x.what() << std::endl;
        }

        secondary = true;
    }
}